

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_form_suite.cpp
# Opt level: O3

void __thiscall reader_query_form_suite::test_no_value_two::test_method(test_no_value_two *this)

{
  view_type *view;
  bool bVar1;
  int iVar2;
  uint local_2e4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e0;
  view_type local_2d8;
  undefined1 local_2c8;
  undefined8 *local_2c0;
  view_type *local_2b8;
  undefined **local_2b0;
  undefined1 local_2a8;
  undefined8 *local_2a0;
  view_type **local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  view_type *local_270;
  char *local_268;
  undefined **local_260;
  undefined1 local_258;
  undefined8 *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  shared_count sStack_230;
  basic_query_form<char> local_228;
  char input [14];
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  builtin_strncpy(input + 8,"ravo=",6);
  builtin_strncpy(input,"alpha=&b",8);
  local_228.super_base<char,_trial::url::reader::basic_query_form>.input.len_ = strlen(input);
  local_228.super_base<char,_trial::url::reader::basic_query_form>.current_token = end;
  local_228.super_base<char,_trial::url::reader::basic_query_form>._36_1_ = 1;
  local_228.super_base<char,_trial::url::reader::basic_query_form>.input.ptr_ = input;
  local_228.super_base<char,_trial::url::reader::basic_query_form>.current_view.ptr_ = input;
  local_228.super_base<char,_trial::url::reader::basic_query_form>.current_view.len_ =
       local_228.super_base<char,_trial::url::reader::basic_query_form>.input.len_;
  trial::url::reader::basic_query_form<char>::do_next(&local_228);
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x90);
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_00186288;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  local_270 = &local_2d8;
  local_2d8.ptr_ =
       (char *)CONCAT44(local_2d8.ptr_._4_4_,
                        local_228.super_base<char,_trial::url::reader::basic_query_form>.
                        current_token);
  local_2e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2e4;
  local_2e4 = 10;
  local_290._M_dataplus._M_p._0_1_ =
       local_228.super_base<char,_trial::url::reader::basic_query_form>.current_token ==
       query_form_key;
  local_290._M_string_length = 0;
  local_290.field_2._M_allocated_capacity = 0;
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_238 = "";
  local_298 = &local_270;
  local_2a8 = 0;
  local_2b0 = &PTR__lazy_ostream_00186618;
  local_2a0 = &boost::unit_test::lazy_ostream::inst;
  local_2c8 = 0;
  local_2b8 = (view_type *)&local_2e0;
  local_2d8.len_ = (size_t)&PTR__lazy_ostream_00186618;
  local_2c0 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_290.field_2._M_allocated_capacity);
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x91);
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_00186288;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  if (local_228.super_base<char,_trial::url::reader::basic_query_form>.current_view.len_ == 5) {
    local_290._M_dataplus._M_p._0_1_ =
         (char)*(int *)((long)local_228.super_base<char,_trial::url::reader::basic_query_form>.
                              current_view.ptr_ + 4) == 'a' &&
         *(int *)local_228.super_base<char,_trial::url::reader::basic_query_form>.current_view.ptr_
         == 0x68706c61;
  }
  else {
    local_290._M_dataplus._M_p._0_1_ = false;
  }
  local_290._M_string_length = 0;
  local_290.field_2._M_allocated_capacity = 0;
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_238 = "";
  local_2a8 = 0;
  local_2b0 = &PTR__lazy_ostream_00186598;
  local_2a0 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1730e2;
  local_2c8 = 0;
  local_2d8.len_ = (size_t)&PTR__lazy_ostream_00186498;
  local_2c0 = &boost::unit_test::lazy_ostream::inst;
  local_2b8 = (view_type *)&local_2e0;
  local_298 = &local_270;
  local_270 = &local_228.super_base<char,_trial::url::reader::basic_query_form>.current_view;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,&local_260,&local_240,0x91,2,2,2,"reader.literal()",&local_2b0,"\"alpha\"",
             &local_2d8.len_);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_290.field_2._M_allocated_capacity);
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x92);
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_00186288;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  local_290._M_dataplus._M_p._0_1_ = trial::url::reader::basic_query_form<char>::do_next(&local_228)
  ;
  local_2d8.ptr_ = (char *)CONCAT71(local_2d8.ptr_._1_7_,local_290._M_dataplus._M_p._0_1_);
  local_2e4 = CONCAT31(local_2e4._1_3_,1);
  local_290._M_string_length = 0;
  local_290.field_2._M_allocated_capacity = 0;
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_238 = "";
  local_270 = &local_2d8;
  local_2a8 = 0;
  local_2b0 = &PTR__lazy_ostream_001865d8;
  local_2a0 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2e4;
  local_2c8 = 0;
  local_2d8.len_ = (size_t)&PTR__lazy_ostream_001865d8;
  local_2c0 = &boost::unit_test::lazy_ostream::inst;
  local_2b8 = (view_type *)&local_2e0;
  local_298 = &local_270;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,&local_260,&local_240,0x92,2,2,2,"reader.next()",&local_2b0,"true",
             &local_2d8.len_);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_290.field_2._M_allocated_capacity);
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x93);
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_00186288;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  local_290._M_dataplus._M_p._0_1_ =
       local_228.super_base<char,_trial::url::reader::basic_query_form>.current_token ==
       query_form_value;
  local_2d8.ptr_ =
       (char *)CONCAT44(local_2d8.ptr_._4_4_,
                        local_228.super_base<char,_trial::url::reader::basic_query_form>.
                        current_token);
  local_2e4 = 0xb;
  local_290._M_string_length = 0;
  local_290.field_2._M_allocated_capacity = 0;
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_238 = "";
  local_270 = &local_2d8;
  local_2a8 = 0;
  local_2b0 = &PTR__lazy_ostream_00186618;
  local_2a0 = &boost::unit_test::lazy_ostream::inst;
  local_298 = &local_270;
  local_2e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2e4;
  local_2c8 = 0;
  local_2d8.len_ = (size_t)&PTR__lazy_ostream_00186618;
  local_2c0 = &boost::unit_test::lazy_ostream::inst;
  local_2b8 = (view_type *)&local_2e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,&local_260,&local_240,0x93,2,2,2,"reader.subcode()",&local_2b0,
             "url::token::subcode::query_form_value",&local_2d8.len_);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_290.field_2._M_allocated_capacity);
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x94);
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_00186288;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_290._M_dataplus._M_p._0_1_ =
       local_228.super_base<char,_trial::url::reader::basic_query_form>.current_view.len_ == 0;
  local_248 = "";
  local_290._M_string_length = 0;
  local_290.field_2._M_allocated_capacity = 0;
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_238 = "";
  local_270 = &local_228.super_base<char,_trial::url::reader::basic_query_form>.current_view;
  local_2a8 = 0;
  local_2b0 = &PTR__lazy_ostream_00186598;
  local_2a0 = &boost::unit_test::lazy_ostream::inst;
  local_298 = &local_270;
  local_2e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x173189;
  local_2c8 = 0;
  local_2d8.len_ = (size_t)&PTR__lazy_ostream_00186318;
  local_2c0 = &boost::unit_test::lazy_ostream::inst;
  local_2b8 = (view_type *)&local_2e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,&local_260,&local_240,0x94,2,2,2,"reader.literal()",&local_2b0,"\"\"",
             &local_2d8.len_);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_290.field_2._M_allocated_capacity);
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x95);
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_00186288;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  trial::url::reader::detail::
  converter<char,_trial::url::reader::basic_query_form,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::convert(&local_290,
            &local_228.super_base<char,_trial::url::reader::basic_query_form>.current_view);
  iVar2 = std::__cxx11::string::compare((char *)&local_290);
  local_240 = (char *)CONCAT71(local_240._1_7_,iVar2 == 0);
  local_238 = (char *)0x0;
  sStack_230.pi_ = (sp_counted_base *)0x0;
  local_270 = (view_type *)0x1737c8;
  local_268 = "";
  local_2a8 = 0;
  local_2b0 = &PTR__lazy_ostream_001862d8;
  local_2a0 = &boost::unit_test::lazy_ostream::inst;
  local_298 = (view_type **)&local_2e0;
  local_2d8.ptr_ = "";
  local_2c8 = 0;
  local_2d8.len_ = (size_t)&PTR__lazy_ostream_00186318;
  local_2c0 = &boost::unit_test::lazy_ostream::inst;
  local_2b8 = &local_2d8;
  local_2e0 = &local_290;
  boost::test_tools::tt_detail::report_assertion
            (&local_240,&local_260,&local_270,0x95,2,2,2,"reader.value<std::string>()",&local_2b0,
             "\"\"",&local_2d8.len_);
  boost::detail::shared_count::~shared_count(&sStack_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_290._M_dataplus._M_p._1_7_,local_290._M_dataplus._M_p._0_1_) !=
      &local_290.field_2) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_290._M_dataplus._M_p._1_7_,local_290._M_dataplus._M_p._0_1_),
                    local_290.field_2._M_allocated_capacity + 1);
  }
  local_100 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x96);
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_00186288;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  local_290._M_dataplus._M_p._0_1_ = trial::url::reader::basic_query_form<char>::do_next(&local_228)
  ;
  local_270 = &local_2d8;
  local_2d8.ptr_ = (char *)CONCAT71(local_2d8.ptr_._1_7_,local_290._M_dataplus._M_p._0_1_);
  local_2e4 = CONCAT31(local_2e4._1_3_,1);
  local_290._M_string_length = 0;
  local_290.field_2._M_allocated_capacity = 0;
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_238 = "";
  local_2a8 = 0;
  local_2b0 = &PTR__lazy_ostream_001865d8;
  local_2a0 = &boost::unit_test::lazy_ostream::inst;
  local_298 = &local_270;
  local_2c8 = 0;
  local_2d8.len_ = (size_t)&PTR__lazy_ostream_001865d8;
  local_2c0 = &boost::unit_test::lazy_ostream::inst;
  local_2b8 = (view_type *)&local_2e0;
  local_2e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2e4;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,&local_260,&local_240,0x96,2,2,2,"reader.next()",&local_2b0,"true",
             &local_2d8.len_);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_290.field_2._M_allocated_capacity);
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x97);
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_00186288;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  local_290._M_dataplus._M_p._0_1_ =
       local_228.super_base<char,_trial::url::reader::basic_query_form>.current_token ==
       query_form_key;
  local_2d8.ptr_ =
       (char *)CONCAT44(local_2d8.ptr_._4_4_,
                        local_228.super_base<char,_trial::url::reader::basic_query_form>.
                        current_token);
  local_2e4 = 10;
  local_290._M_string_length = 0;
  local_290.field_2._M_allocated_capacity = 0;
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_238 = "";
  local_2a8 = 0;
  local_2b0 = &PTR__lazy_ostream_00186618;
  local_2a0 = &boost::unit_test::lazy_ostream::inst;
  local_298 = &local_270;
  local_2e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2e4;
  local_2c8 = 0;
  local_2d8.len_ = (size_t)&PTR__lazy_ostream_00186618;
  local_2c0 = &boost::unit_test::lazy_ostream::inst;
  local_2b8 = (view_type *)&local_2e0;
  local_270 = &local_2d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,&local_260,&local_240,0x97,2,2,2,"reader.subcode()",&local_2b0,
             "url::token::subcode::query_form_key",&local_2d8.len_);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_290.field_2._M_allocated_capacity);
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x98);
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_00186288;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  if (local_228.super_base<char,_trial::url::reader::basic_query_form>.current_view.len_ == 5) {
    local_290._M_dataplus._M_p._0_1_ =
         (char)*(int *)((long)local_228.super_base<char,_trial::url::reader::basic_query_form>.
                              current_view.ptr_ + 4) == 'o' &&
         *(int *)local_228.super_base<char,_trial::url::reader::basic_query_form>.current_view.ptr_
         == 0x76617262;
  }
  else {
    local_290._M_dataplus._M_p._0_1_ = false;
  }
  local_270 = &local_228.super_base<char,_trial::url::reader::basic_query_form>.current_view;
  local_298 = &local_270;
  local_290._M_string_length = 0;
  local_290.field_2._M_allocated_capacity = 0;
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_238 = "";
  local_2a8 = 0;
  local_2b0 = &PTR__lazy_ostream_00186598;
  local_2a0 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1730dc;
  local_2c8 = 0;
  local_2d8.len_ = (size_t)&PTR__lazy_ostream_00186498;
  local_2c0 = &boost::unit_test::lazy_ostream::inst;
  local_2b8 = (view_type *)&local_2e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,&local_260,&local_240,0x98,2,2,2,"reader.literal()",&local_2b0,"\"bravo\"",
             &local_2d8.len_);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_290.field_2._M_allocated_capacity);
  local_160 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x99);
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_00186288;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  local_290._M_dataplus._M_p._0_1_ = trial::url::reader::basic_query_form<char>::do_next(&local_228)
  ;
  local_2d8.ptr_ = (char *)CONCAT71(local_2d8.ptr_._1_7_,local_290._M_dataplus._M_p._0_1_);
  local_2e4 = CONCAT31(local_2e4._1_3_,1);
  local_290._M_string_length = 0;
  local_290.field_2._M_allocated_capacity = 0;
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_238 = "";
  local_2a8 = 0;
  local_2b0 = &PTR__lazy_ostream_001865d8;
  local_2a0 = &boost::unit_test::lazy_ostream::inst;
  local_298 = &local_270;
  local_2e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2e4;
  local_2c8 = 0;
  local_2d8.len_ = (size_t)&PTR__lazy_ostream_001865d8;
  local_2c0 = &boost::unit_test::lazy_ostream::inst;
  local_2b8 = (view_type *)&local_2e0;
  local_270 = &local_2d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,&local_260,&local_240,0x99,2,2,2,"reader.next()",&local_2b0,"true",
             &local_2d8.len_);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_290.field_2._M_allocated_capacity);
  local_180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_180,0x9a);
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_00186288;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  local_290._M_dataplus._M_p._0_1_ =
       local_228.super_base<char,_trial::url::reader::basic_query_form>.current_token ==
       query_form_value;
  local_2d8.ptr_ =
       (char *)CONCAT44(local_2d8.ptr_._4_4_,
                        local_228.super_base<char,_trial::url::reader::basic_query_form>.
                        current_token);
  local_2e4 = 0xb;
  local_290._M_string_length = 0;
  local_290.field_2._M_allocated_capacity = 0;
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_238 = "";
  local_270 = &local_2d8;
  local_2a8 = 0;
  local_2b0 = &PTR__lazy_ostream_00186618;
  local_2a0 = &boost::unit_test::lazy_ostream::inst;
  local_298 = &local_270;
  local_2e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2e4;
  local_2c8 = 0;
  local_2d8.len_ = (size_t)&PTR__lazy_ostream_00186618;
  local_2c0 = &boost::unit_test::lazy_ostream::inst;
  local_2b8 = (view_type *)&local_2e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,&local_260,&local_240,0x9a,2,2,2,"reader.subcode()",&local_2b0,
             "url::token::subcode::query_form_value",&local_2d8.len_);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_290.field_2._M_allocated_capacity);
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a0,0x9b);
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_00186288;
  local_290._M_dataplus._M_p._0_1_ =
       local_228.super_base<char,_trial::url::reader::basic_query_form>.current_view.len_ == 0;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  local_290._M_string_length = 0;
  local_290.field_2._M_allocated_capacity = 0;
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_238 = "";
  view = &local_228.super_base<char,_trial::url::reader::basic_query_form>.current_view;
  local_2a8 = 0;
  local_2b0 = &PTR__lazy_ostream_00186598;
  local_2a0 = &boost::unit_test::lazy_ostream::inst;
  local_298 = &local_270;
  local_2e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x173189;
  local_2c8 = 0;
  local_2d8.len_ = (size_t)&PTR__lazy_ostream_00186318;
  local_2c0 = &boost::unit_test::lazy_ostream::inst;
  local_2b8 = (view_type *)&local_2e0;
  local_270 = view;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,&local_260,&local_240,0x9b,2,2,2,"reader.literal()",&local_2b0,"\"\"",
             &local_2d8.len_);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_290.field_2._M_allocated_capacity);
  local_1c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c0,0x9c);
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_00186288;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  trial::url::reader::detail::
  converter<char,_trial::url::reader::basic_query_form,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::convert(&local_290,view);
  iVar2 = std::__cxx11::string::compare((char *)&local_290);
  local_240 = (char *)CONCAT71(local_240._1_7_,iVar2 == 0);
  local_238 = (char *)0x0;
  sStack_230.pi_ = (sp_counted_base *)0x0;
  local_270 = (view_type *)0x1737c8;
  local_268 = "";
  local_2a8 = 0;
  local_2b0 = &PTR__lazy_ostream_001862d8;
  local_2a0 = &boost::unit_test::lazy_ostream::inst;
  local_298 = (view_type **)&local_2e0;
  local_2d8.ptr_ = "";
  local_2c8 = 0;
  local_2d8.len_ = (size_t)&PTR__lazy_ostream_00186318;
  local_2c0 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = &local_290;
  local_2b8 = &local_2d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_240,&local_260,&local_270,0x9c,2,2,2,"reader.value<std::string>()",&local_2b0,
             "\"\"",&local_2d8.len_);
  boost::detail::shared_count::~shared_count(&sStack_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_290._M_dataplus._M_p._1_7_,local_290._M_dataplus._M_p._0_1_) !=
      &local_290.field_2) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_290._M_dataplus._M_p._1_7_,local_290._M_dataplus._M_p._0_1_),
                    local_290.field_2._M_allocated_capacity + 1);
  }
  local_1e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_1d8 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1e0,0x9d);
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_00186288;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  bVar1 = trial::url::reader::basic_query_form<char>::do_next(&local_228);
  local_2d8.ptr_ = (char *)CONCAT71(local_2d8.ptr_._1_7_,bVar1);
  local_2e4 = local_2e4 & 0xffffff00;
  local_290._M_dataplus._M_p._0_1_ = !bVar1;
  local_290._M_string_length = 0;
  local_290.field_2._M_allocated_capacity = 0;
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_238 = "";
  local_2a8 = 0;
  local_2b0 = &PTR__lazy_ostream_001865d8;
  local_2a0 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2e4;
  local_2c8 = 0;
  local_2d8.len_ = (size_t)&PTR__lazy_ostream_001865d8;
  local_2c0 = &boost::unit_test::lazy_ostream::inst;
  local_2b8 = (view_type *)&local_2e0;
  local_298 = &local_270;
  local_270 = &local_2d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_290,&local_260,&local_240,0x9d,2,2,2,"reader.next()",&local_2b0,"false",
             &local_2d8.len_);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_290.field_2._M_allocated_capacity);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_no_value_two)
{
    const char input[] = "alpha=&bravo=";
    url::reader::query_form reader(input);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::query_form_key);
    BOOST_REQUIRE_EQUAL(reader.literal(), "alpha");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::query_form_value);
    BOOST_REQUIRE_EQUAL(reader.literal(), "");
    BOOST_REQUIRE_EQUAL(reader.value<std::string>(), "");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::query_form_key);
    BOOST_REQUIRE_EQUAL(reader.literal(), "bravo");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::query_form_value);
    BOOST_REQUIRE_EQUAL(reader.literal(), "");
    BOOST_REQUIRE_EQUAL(reader.value<std::string>(), "");
    BOOST_REQUIRE_EQUAL(reader.next(), false);
}